

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

Script * cfd::GetLockingScriptFromUtxoData(Script *__return_storage_ptr__,UtxoData *utxo)

{
  Descriptor desc;
  Script SStack_1c8;
  DescriptorNode local_190;
  
  core::Script::Script(__return_storage_ptr__,&utxo->locking_script);
  core::Address::GetAddress_abi_cxx11_(&local_190.name_,&utxo->address);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_190.name_._M_string_length == 0) {
    if ((utxo->descriptor)._M_string_length != 0) {
      core::Descriptor::Parse
                ((Descriptor *)&local_190,&utxo->descriptor,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,kMainnet);
      core::Descriptor::GetLockingScript(&SStack_1c8,(Descriptor *)&local_190);
      core::Script::operator=(__return_storage_ptr__,&SStack_1c8);
      core::Script::~Script(&SStack_1c8);
      core::DescriptorNode::~DescriptorNode(&local_190);
    }
  }
  else {
    core::Address::GetLockingScript((Script *)&local_190,&utxo->address);
    core::Script::operator=(__return_storage_ptr__,(Script *)&local_190);
    core::Script::~Script((Script *)&local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

static Script GetLockingScriptFromUtxoData(const UtxoData& utxo) {
  Script locking_script = utxo.locking_script;
  if (!utxo.address.GetAddress().empty()) {
    locking_script = utxo.address.GetLockingScript();
  } else if (!utxo.descriptor.empty()) {
    auto desc = Descriptor::Parse(utxo.descriptor);
    locking_script = desc.GetLockingScript();
  }
  return locking_script;
}